

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O2

xmlModulePtr xmlModuleOpen(char *name,int options)

{
  xmlModulePtr pxVar1;
  void *pvVar2;
  xmlChar *pxVar3;
  
  pxVar1 = (xmlModulePtr)(*xmlMalloc)(0x10);
  if (pxVar1 != (xmlModulePtr)0x0) {
    pxVar1->name = (uchar *)0x0;
    pxVar1->handle = (void *)0x0;
    pvVar2 = (void *)dlopen(name,0x102);
    pxVar1->handle = pvVar2;
    if (pvVar2 != (void *)0x0) {
      pxVar3 = xmlStrdup((xmlChar *)name);
      pxVar1->name = pxVar3;
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlModulePtr)0x0;
}

Assistant:

xmlModulePtr
xmlModuleOpen(const char *name, int options ATTRIBUTE_UNUSED)
{
    xmlModulePtr module;

    module = (xmlModulePtr) xmlMalloc(sizeof(xmlModule));
    if (module == NULL)
        return (NULL);

    memset(module, 0, sizeof(xmlModule));

    module->handle = xmlModulePlatformOpen(name);

    if (module->handle == NULL) {
        xmlFree(module);
        return(NULL);
    }

    module->name = xmlStrdup((const xmlChar *) name);
    return (module);
}